

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cppjit.cpp
# Opt level: O2

void test_call_kernels::test_void(void)

{
  ostream *poVar1;
  allocator local_29;
  string local_28;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"testing kernel with void arguments");
  std::endl<char,std::char_traits<char>>(poVar1);
  cppjit::void_kernel[0x50] = 1;
  if (cppjit::void_kernel._32_8_ != 0) {
    *(undefined1 *)(cppjit::void_kernel._32_8_ + 0x28) = 1;
  }
  std::__cxx11::string::string
            ((string *)&local_28,"extern \"C\" void void_kernel(void) {}",&local_29);
  cppjit::kernel<void,_cppjit::detail::pack<>_>::compile_inline
            ((kernel<void,_cppjit::detail::pack<>_> *)cppjit::void_kernel,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  cppjit::kernel<void,_cppjit::detail::pack<>_>::operator()
            ((kernel<void,_cppjit::detail::pack<>_> *)cppjit::void_kernel);
  return;
}

Assistant:

void test_void() {
  std::cout << "testing kernel with void arguments" << std::endl;
  cppjit::void_kernel.set_verbose(true);
  cppjit::void_kernel.compile_inline("extern \"C\" void "
                                     "void_kernel(void) {}");

  cppjit::void_kernel();
}